

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O3

bool re2::Regexp::SimplifyRegexp(StringPiece *src,ParseFlags flags,string *dst,RegexpStatus *status)

{
  size_type sVar1;
  Regexp *this;
  Regexp *this_00;
  string local_48;
  
  this = Parse(src,flags,status);
  if (this != (Regexp *)0x0) {
    this_00 = Simplify(this);
    Decref(this);
    if (this_00 != (Regexp *)0x0) {
      ToString_abi_cxx11_(&local_48,this_00);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)dst,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      Decref(this_00);
      return true;
    }
    if (status != (RegexpStatus *)0x0) {
      status->code_ = kRegexpInternalError;
      sVar1 = src->size_;
      (status->error_arg_).data_ = src->data_;
      (status->error_arg_).size_ = sVar1;
    }
  }
  return false;
}

Assistant:

bool Regexp::SimplifyRegexp(const StringPiece& src, ParseFlags flags,
                            std::string* dst, RegexpStatus* status) {
  Regexp* re = Parse(src, flags, status);
  if (re == NULL)
    return false;
  Regexp* sre = re->Simplify();
  re->Decref();
  if (sre == NULL) {
    if (status) {
      status->set_code(kRegexpInternalError);
      status->set_error_arg(src);
    }
    return false;
  }
  *dst = sre->ToString();
  sre->Decref();
  return true;
}